

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall
asmjit::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,uint32_t relocType)

{
  size_type *psVar1;
  uint32_t uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  Error EVar7;
  RelocEntry *pRVar8;
  long lVar9;
  ulong uVar10;
  ZoneAllocator *allocator;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  size_t local_30;
  
  allocator = &this->_allocator;
  EVar7 = 0;
  if ((this->_relocations).super_ZoneVectorBase._capacity ==
      (this->_relocations).super_ZoneVectorBase._size) {
    EVar7 = ZoneVectorBase::_grow(&(this->_relocations).super_ZoneVectorBase,allocator,8,1);
  }
  if (EVar7 == 0) {
    uVar2 = (this->_relocations).super_ZoneVectorBase._size;
    if (uVar2 == 0xffffffff) {
      EVar7 = 0x17;
    }
    else {
      if (allocator->_zone == (Zone *)0x0) {
        newRelocEntry();
      }
      else {
        pRVar8 = (RelocEntry *)ZoneAllocator::_allocZeroed(allocator,0x28,&local_30);
        if (pRVar8 != (RelocEntry *)0x0) {
          pRVar8->_id = uVar2;
          pRVar8->_relocType = relocType & 0xff;
          pRVar8->_sourceSectionId = 0xffffffff;
          pRVar8->_targetSectionId = 0xffffffff;
          uVar3 = (this->_relocations).super_ZoneVectorBase._size;
          if (uVar3 < (this->_relocations).super_ZoneVectorBase._capacity) {
            *(RelocEntry **)
             ((long)(this->_relocations).super_ZoneVectorBase._data + (ulong)uVar3 * 8) = pRVar8;
            psVar1 = &(this->_relocations).super_ZoneVectorBase._size;
            *psVar1 = *psVar1 + 1;
            *dst = pRVar8;
            return 0;
          }
          newRelocEntry();
          lVar4 = *(long *)(allocator + 2);
          uVar10 = (ulong)*(uint32_t *)((long)(allocator + 2) + 8);
          bVar15 = uVar10 == 0;
          if (!bVar15) {
            lVar11 = 0;
            uVar14 = 0;
            do {
              lVar9 = *(long *)(lVar4 + lVar11);
              uVar12 = *(ulong *)(lVar9 + 0x50);
              if (*(ulong *)(lVar9 + 0x50) < *(ulong *)(lVar9 + 0x18)) {
                uVar12 = *(ulong *)(lVar9 + 0x18);
              }
              if (uVar12 == 0) {
                bVar6 = true;
              }
              else {
                uVar13 = -(ulong)*(uint *)(lVar9 + 8) & (uVar14 + *(uint *)(lVar9 + 8)) - 1;
                if (uVar13 < uVar14) {
                  bVar6 = false;
                }
                else {
                  uVar14 = uVar13 + uVar12;
                  bVar6 = !CARRY8(uVar13,uVar12);
                }
              }
              if (!bVar6) break;
              lVar11 = lVar11 + 8;
              bVar15 = uVar10 * 8 - lVar11 == 0;
            } while (!bVar15);
          }
          EVar7 = 9;
          if (bVar15) {
            if (uVar10 != 0) {
              lVar9 = 0;
              uVar14 = 0;
              lVar11 = 0;
              do {
                lVar5 = *(long *)(lVar4 + lVar9);
                uVar12 = *(ulong *)(lVar5 + 0x50);
                if (*(ulong *)(lVar5 + 0x50) < *(ulong *)(lVar5 + 0x18)) {
                  uVar12 = *(ulong *)(lVar5 + 0x18);
                }
                if (uVar12 != 0) {
                  uVar14 = -(ulong)*(uint *)(lVar5 + 8) & (uVar14 + *(uint *)(lVar5 + 8)) - 1;
                }
                *(ulong *)(lVar5 + 0x10) = uVar14;
                if (lVar11 != 0) {
                  *(ulong *)(lVar11 + 0x18) = uVar14 - *(long *)(lVar11 + 0x10);
                }
                uVar14 = uVar14 + uVar12;
                lVar9 = lVar9 + 8;
                lVar11 = lVar5;
              } while (uVar10 << 3 != lVar9);
            }
            EVar7 = 0;
          }
          return EVar7;
        }
      }
      EVar7 = 1;
    }
  }
  return EVar7;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, uint32_t relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = uint8_t(relocType);
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}